

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O0

char * ulocimp_toBcpType_63(char *key,char *type,UBool *isKnownKey,UBool *isSpecialType)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  char local_41;
  UBool matched;
  LocExtType *t;
  LocExtKeyData *keyData;
  UBool *isSpecialType_local;
  UBool *isKnownKey_local;
  char *type_local;
  char *key_local;
  
  if (isKnownKey != (UBool *)0x0) {
    *isKnownKey = '\0';
  }
  if (isSpecialType != (UBool *)0x0) {
    *isSpecialType = '\0';
  }
  iVar1 = init((EVP_PKEY_CTX *)key);
  if (((char)iVar1 != '\0') && (pvVar2 = uhash_get_63(gLocExtKeyMap,key), pvVar2 != (void *)0x0)) {
    if (isKnownKey != (UBool *)0x0) {
      *isKnownKey = '\x01';
    }
    pvVar3 = uhash_get_63(*(UHashtable **)((long)pvVar2 + 0x10),type);
    if (pvVar3 != (void *)0x0) {
      return *(char **)((long)pvVar3 + 8);
    }
    if (*(int *)((long)pvVar2 + 0x18) != 0) {
      local_41 = '\0';
      if ((*(uint *)((long)pvVar2 + 0x18) & 1) != 0) {
        local_41 = isSpecialTypeCodepoints(type);
      }
      if ((local_41 == '\0') && ((*(uint *)((long)pvVar2 + 0x18) & 2) != 0)) {
        local_41 = isSpecialTypeReorderCode(type);
      }
      if ((local_41 == '\0') && ((*(uint *)((long)pvVar2 + 0x18) & 4) != 0)) {
        local_41 = isSpecialTypeRgKeyValue(type);
      }
      if (local_41 != '\0') {
        if (isSpecialType != (UBool *)0x0) {
          *isSpecialType = '\x01';
          return type;
        }
        return type;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

U_CFUNC const char*
ulocimp_toBcpType(const char* key, const char* type, UBool* isKnownKey, UBool* isSpecialType) {
    if (isKnownKey != NULL) {
        *isKnownKey = FALSE;
    }
    if (isSpecialType != NULL) {
        *isSpecialType = FALSE;
    }

    if (!init()) {
        return NULL;
    }

    LocExtKeyData* keyData = (LocExtKeyData*)uhash_get(gLocExtKeyMap, key);
    if (keyData != NULL) {
        if (isKnownKey != NULL) {
            *isKnownKey = TRUE;
        }
        LocExtType* t = (LocExtType*)uhash_get(keyData->typeMap, type);
        if (t != NULL) {
            return t->bcpId;
        }
        if (keyData->specialTypes != SPECIALTYPE_NONE) {
            UBool matched = FALSE;
            if (keyData->specialTypes & SPECIALTYPE_CODEPOINTS) {
                matched = isSpecialTypeCodepoints(type);
            }
            if (!matched && keyData->specialTypes & SPECIALTYPE_REORDER_CODE) {
                matched = isSpecialTypeReorderCode(type);
            }
            if (!matched && keyData->specialTypes & SPECIALTYPE_RG_KEY_VALUE) {
                matched = isSpecialTypeRgKeyValue(type);
            }
            if (matched) {
                if (isSpecialType != NULL) {
                    *isSpecialType = TRUE;
                }
                return type;
            }
        }
    }
    return NULL;
}